

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# JointActionObservationHistory.cpp
# Opt level: O2

void __thiscall
JointActionObservationHistory::GetJointActionObservationHistoryVectors
          (JointActionObservationHistory *this,
          vector<unsigned_int,_std::allocator<unsigned_int>_> *jaIs,
          vector<unsigned_int,_std::allocator<unsigned_int>_> *joIs)

{
  __normal_iterator<unsigned_int_*,_std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>
  __tmp_1;
  value_type_conflict1 *pvVar1;
  __normal_iterator<unsigned_int_*,_std::vector<unsigned_int,_std::allocator<unsigned_int>_>_> __tmp
  ;
  pointer __x;
  vector<unsigned_int,_std::allocator<unsigned_int>_> joIsReversed;
  vector<unsigned_int,_std::allocator<unsigned_int>_> jaIsReversed;
  _Vector_base<unsigned_int,_std::allocator<unsigned_int>_> local_58;
  _Vector_base<unsigned_int,_std::allocator<unsigned_int>_> local_38;
  
  local_58._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  local_38._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  local_38._M_impl.super__Vector_impl_data._M_start = (value_type_conflict1 *)0x0;
  local_38._M_impl.super__Vector_impl_data._M_finish = (value_type_conflict1 *)0x0;
  local_58._M_impl.super__Vector_impl_data._M_start = (value_type_conflict1 *)0x0;
  local_58._M_impl.super__Vector_impl_data._M_finish = (value_type_conflict1 *)0x0;
  GetJointActionObservationHistoryVectorsRecursive
            (this,(vector<unsigned_int,_std::allocator<unsigned_int>_> *)&local_38,
             (vector<unsigned_int,_std::allocator<unsigned_int>_> *)&local_58);
  __x = local_38._M_impl.super__Vector_impl_data._M_finish;
  while (pvVar1 = local_58._M_impl.super__Vector_impl_data._M_finish,
        __x != local_38._M_impl.super__Vector_impl_data._M_start) {
    __x = __x + -1;
    std::vector<unsigned_int,_std::allocator<unsigned_int>_>::push_back(jaIs,__x);
  }
  while (pvVar1 != local_58._M_impl.super__Vector_impl_data._M_start) {
    std::vector<unsigned_int,_std::allocator<unsigned_int>_>::push_back(joIs,pvVar1 + -1);
    pvVar1 = pvVar1 + -1;
  }
  std::_Vector_base<unsigned_int,_std::allocator<unsigned_int>_>::~_Vector_base(&local_58);
  std::_Vector_base<unsigned_int,_std::allocator<unsigned_int>_>::~_Vector_base(&local_38);
  return;
}

Assistant:

void 
JointActionObservationHistory::GetJointActionObservationHistoryVectors(
//    JointActionObservationHistory *joah,
    vector<Index> &jaIs, vector<Index> &joIs)
{
    vector<Index> jaIsReversed;
    vector<Index> joIsReversed;

    GetJointActionObservationHistoryVectorsRecursive( jaIsReversed,
            joIsReversed);

    // reverse both vectors
    for(vector<Index>::reverse_iterator it=jaIsReversed.rbegin();
        it!=jaIsReversed.rend(); ++it)
        jaIs.push_back(*it);

    for(vector<Index>::reverse_iterator it=joIsReversed.rbegin();
        it!=joIsReversed.rend(); ++it)
        joIs.push_back(*it);

#if DEBUG_JAOH
    cout << SoftPrint() << " " << SoftPrintVector(jaIsReversed) << " "
         << SoftPrintVector(joIsReversed) << endl;
#endif
}